

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::EnumOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::UninterpretedOption>);
    }
    uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((EnumOptions *)&stack0xffffffffffffffd0);
          goto LAB_001aa61c;
        }
        to_msg_00 = (MessageLite *)to_msg[4]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar3 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,from_msg_00);
          to_msg[4]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
        }
        else {
          FeatureSet::MergeImpl(to_msg_00,from_msg_00);
        }
      }
      if ((uVar1 & 2) != 0) {
        *(undefined1 *)&to_msg[5]._vptr_MessageLite = *(undefined1 *)&from_msg[5]._vptr_MessageLite;
      }
      if ((uVar1 & 4) != 0) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 1) =
             *(undefined1 *)((long)&from_msg[5]._vptr_MessageLite + 1);
      }
      if ((uVar1 & 8) != 0) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 2) =
             *(undefined1 *)((long)&from_msg[5]._vptr_MessageLite + 2);
      }
    }
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
    internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_EnumOptions_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_001aa61c:
  MergeImpl();
}

Assistant:

void EnumOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumOptions*>(&to_msg);
  auto& from = static_cast<const EnumOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.allow_alias_ = from._impl_.allow_alias_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.deprecated_legacy_json_field_conflicts_ = from._impl_.deprecated_legacy_json_field_conflicts_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}